

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageLevel.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepImageLevel::moveSamplesToNewBuffer
          (DeepImageLevel *this,uint *oldNumSamples,uint *newNumSamples,
          size_t *newSampleListPositions)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_channels)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 2) + 0x38))
              (*(long **)(p_Var1 + 2),oldNumSamples,newNumSamples,newSampleListPositions);
  }
  return;
}

Assistant:

void
DeepImageLevel::moveSamplesToNewBuffer
    (const unsigned int * oldNumSamples,
     const unsigned int * newNumSamples,
     const size_t * newSampleListPositions)
{
    for (ChannelMap::iterator j = _channels.begin(); j != _channels.end(); ++j)
    {
        j->second->moveSamplesToNewBuffer (oldNumSamples,
                                           newNumSamples,
                                           newSampleListPositions);
    }
}